

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void get_proj_subspace(uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,
                      int dat_stride,int use_highbitdepth,int32_t *flt0,int flt0_stride,
                      int32_t *flt1,int flt1_stride,int *xq,sgr_params_type *params)

{
  int64_t iVar1;
  long divisor;
  long lVar2;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  uint8_t *in_RDI;
  int64_t *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int32_t *in_stack_00000010;
  int in_stack_00000018;
  int32_t *in_stack_00000020;
  int in_stack_00000028;
  undefined4 *in_stack_00000030;
  int64_t div2;
  int64_t div1;
  int64_t Det_2;
  int64_t Det_1;
  int64_t Det;
  int64_t C [2];
  int64_t H [2] [2];
  int dat_stride_00;
  uint8_t *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  int src_stride_00;
  undefined8 in_stack_ffffffffffffff60;
  int width_00;
  uint8_t *in_stack_ffffffffffffff68;
  long local_88;
  long local_80;
  long local_78;
  int32_t *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  undefined4 uStack_64;
  int32_t *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  
  src_stride_00 = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  memset(&local_78,0,0x20);
  memset(&local_88,0,0x10);
  *in_stack_00000030 = 0;
  in_stack_00000030[1] = 0;
  width_00 = (int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  dat_stride_00 = (int)((ulong)div2 >> 0x20);
  if (in_stack_00000008 == 0) {
    if ((in_ESI & 7) == 0) {
      (*av1_calc_proj_params)
                (in_RDI,in_ESI,in_EDX,in_ECX,(uint8_t *)in_R8,in_R9D,in_stack_00000010,
                 in_stack_00000018,in_stack_00000020,in_stack_00000028,(int64_t (*) [2])&local_78,
                 &local_88,(sgr_params_type *)div2);
    }
    else {
      av1_calc_proj_params_c
                (in_stack_ffffffffffffff68,width_00,(int)in_stack_ffffffffffffff60,src_stride_00,
                 in_stack_ffffffffffffff50,dat_stride_00,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
                 (int64_t (*) [2])CONCAT44(in_R9D,in_stack_ffffffffffffffb0),in_R8,
                 (sgr_params_type *)CONCAT44(in_ECX,in_stack_ffffffffffffffc0));
    }
  }
  else if ((in_ESI & 7) == 0) {
    (*av1_calc_proj_params_high_bd)
              (in_RDI,in_ESI,in_EDX,in_ECX,(uint8_t *)in_R8,in_R9D,in_stack_00000010,
               in_stack_00000018,in_stack_00000020,in_stack_00000028,(int64_t (*) [2])&local_78,
               &local_88,(sgr_params_type *)div2);
  }
  else {
    av1_calc_proj_params_high_bd_c
              (in_stack_ffffffffffffff68,width_00,(int)in_stack_ffffffffffffff60,src_stride_00,
               in_stack_ffffffffffffff50,dat_stride_00,in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,in_stack_ffffffffffffffa8,
               (int64_t (*) [2])CONCAT44(in_R9D,in_stack_ffffffffffffffb0),in_R8,
               (sgr_params_type *)CONCAT44(in_ECX,in_stack_ffffffffffffffc0));
  }
  if (*(int *)div2 == 0) {
    if (in_stack_ffffffffffffffa0 != (int32_t *)0x0) {
      *in_stack_00000030 = 0;
      iVar1 = signed_rounded_divide(local_80 << 7,(int64_t)in_stack_ffffffffffffffa0);
      in_stack_00000030[1] = (int)iVar1;
    }
  }
  else if (*(int *)(div2 + 4) == 0) {
    if (local_78 != 0) {
      iVar1 = signed_rounded_divide(local_88 << 7,local_78);
      *in_stack_00000030 = (int)iVar1;
      in_stack_00000030[1] = 0;
    }
  }
  else {
    divisor = local_78 * (long)in_stack_ffffffffffffffa0 -
              (long)in_stack_ffffffffffffff90 * CONCAT44(uStack_64,in_stack_ffffffffffffff98);
    if (divisor != 0) {
      lVar2 = (long)in_stack_ffffffffffffffa0 * local_88 -
              (long)in_stack_ffffffffffffff90 * local_80;
      if (((lVar2 < 1) || (lVar2 < 0x100000000000000)) &&
         ((-1 < lVar2 || (-0x100000000000001 < lVar2)))) {
        iVar1 = signed_rounded_divide(lVar2 * 0x80,divisor);
        *in_stack_00000030 = (int)iVar1;
      }
      else {
        iVar1 = signed_rounded_divide(lVar2,divisor / 0x80);
        *in_stack_00000030 = (int)iVar1;
      }
      lVar2 = local_78 * local_80 - CONCAT44(uStack_64,in_stack_ffffffffffffff98) * local_88;
      if (((lVar2 < 1) || (lVar2 < 0x100000000000000)) &&
         ((-1 < lVar2 || (-0x100000000000001 < lVar2)))) {
        iVar1 = signed_rounded_divide(lVar2 * 0x80,divisor);
        in_stack_00000030[1] = (int)iVar1;
      }
      else {
        iVar1 = signed_rounded_divide(lVar2,divisor / 0x80);
        in_stack_00000030[1] = (int)iVar1;
      }
    }
  }
  return;
}

Assistant:

static inline void get_proj_subspace(const uint8_t *src8, int width, int height,
                                     int src_stride, const uint8_t *dat8,
                                     int dat_stride, int use_highbitdepth,
                                     int32_t *flt0, int flt0_stride,
                                     int32_t *flt1, int flt1_stride, int *xq,
                                     const sgr_params_type *params) {
  int64_t H[2][2] = { { 0, 0 }, { 0, 0 } };
  int64_t C[2] = { 0, 0 };

  // Default values to be returned if the problem becomes ill-posed
  xq[0] = 0;
  xq[1] = 0;

  if (!use_highbitdepth) {
    if ((width & 0x7) == 0) {
      av1_calc_proj_params(src8, width, height, src_stride, dat8, dat_stride,
                           flt0, flt0_stride, flt1, flt1_stride, H, C, params);
    } else {
      av1_calc_proj_params_c(src8, width, height, src_stride, dat8, dat_stride,
                             flt0, flt0_stride, flt1, flt1_stride, H, C,
                             params);
    }
  }
#if CONFIG_AV1_HIGHBITDEPTH
  else {  // NOLINT
    if ((width & 0x7) == 0) {
      av1_calc_proj_params_high_bd(src8, width, height, src_stride, dat8,
                                   dat_stride, flt0, flt0_stride, flt1,
                                   flt1_stride, H, C, params);
    } else {
      av1_calc_proj_params_high_bd_c(src8, width, height, src_stride, dat8,
                                     dat_stride, flt0, flt0_stride, flt1,
                                     flt1_stride, H, C, params);
    }
  }
#endif

  if (params->r[0] == 0) {
    // H matrix is now only the scalar H[1][1]
    // C vector is now only the scalar C[1]
    const int64_t Det = H[1][1];
    if (Det == 0) return;  // ill-posed, return default values
    xq[0] = 0;
    xq[1] = (int)signed_rounded_divide(C[1] * (1 << SGRPROJ_PRJ_BITS), Det);
  } else if (params->r[1] == 0) {
    // H matrix is now only the scalar H[0][0]
    // C vector is now only the scalar C[0]
    const int64_t Det = H[0][0];
    if (Det == 0) return;  // ill-posed, return default values
    xq[0] = (int)signed_rounded_divide(C[0] * (1 << SGRPROJ_PRJ_BITS), Det);
    xq[1] = 0;
  } else {
    const int64_t Det = H[0][0] * H[1][1] - H[0][1] * H[1][0];
    if (Det == 0) return;  // ill-posed, return default values

    // If scaling up dividend would overflow, instead scale down the divisor
    const int64_t div1 = H[1][1] * C[0] - H[0][1] * C[1];
    if ((div1 > 0 && INT64_MAX / (1 << SGRPROJ_PRJ_BITS) < div1) ||
        (div1 < 0 && INT64_MIN / (1 << SGRPROJ_PRJ_BITS) > div1))
      xq[0] = (int)signed_rounded_divide(div1, Det / (1 << SGRPROJ_PRJ_BITS));
    else
      xq[0] = (int)signed_rounded_divide(div1 * (1 << SGRPROJ_PRJ_BITS), Det);

    const int64_t div2 = H[0][0] * C[1] - H[1][0] * C[0];
    if ((div2 > 0 && INT64_MAX / (1 << SGRPROJ_PRJ_BITS) < div2) ||
        (div2 < 0 && INT64_MIN / (1 << SGRPROJ_PRJ_BITS) > div2))
      xq[1] = (int)signed_rounded_divide(div2, Det / (1 << SGRPROJ_PRJ_BITS));
    else
      xq[1] = (int)signed_rounded_divide(div2 * (1 << SGRPROJ_PRJ_BITS), Det);
  }
}